

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

sx_thread *
sx_thread_create(sx_alloc *alloc,sx_thread_cb *callback,void *user_data1,int stack_sz,char *name,
                void *user_data2)

{
  code *pcVar1;
  int iVar2;
  size_t sVar3;
  sx_thread *psVar4;
  int local_98;
  undefined1 local_90 [4];
  int r;
  pthread_attr_t attr;
  int local_50;
  int local_4c;
  int var__b;
  int var__a;
  sx_thread *thrd;
  void *user_data2_local;
  char *name_local;
  void *pvStack_28;
  int stack_sz_local;
  void *user_data1_local;
  sx_thread_cb *callback_local;
  sx_alloc *alloc_local;
  
  thrd = (sx_thread *)user_data2;
  user_data2_local = name;
  name_local._4_4_ = stack_sz;
  pvStack_28 = user_data1;
  user_data1_local = callback;
  callback_local = (sx_thread_cb *)alloc;
  _var__b = (sx_thread *)sx__malloc(alloc,0xb0,0,(char *)0x0,(char *)0x0,0);
  if (_var__b == (sx_thread *)0x0) {
    alloc_local = (sx_alloc *)0x0;
  }
  else {
    sx_semaphore_init((sx_sem *)_var__b);
    _var__b->callback = (sx_thread_cb *)user_data1_local;
    _var__b->user_data1 = pvStack_28;
    _var__b->user_data2 = thrd;
    local_4c = name_local._4_4_;
    sVar3 = sx_os_minstacksz();
    local_50 = (int)sVar3;
    local_98 = local_50;
    if (local_50 < local_4c) {
      local_98 = local_4c;
    }
    attr._52_4_ = local_98;
    _var__b->stack_sz = local_98;
    _var__b->running = true;
    iVar2 = pthread_attr_init((pthread_attr_t *)local_90);
    if (iVar2 != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c"
                        ,0xd6,"pthread_attr_init failed");
      pcVar1 = (code *)swi(3);
      psVar4 = (sx_thread *)(*pcVar1)();
      return psVar4;
    }
    iVar2 = pthread_attr_setstacksize((pthread_attr_t *)local_90,(long)_var__b->stack_sz);
    if (iVar2 != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c"
                        ,0xd8,"pthread_attr_setstacksize failed");
      pcVar1 = (code *)swi(3);
      psVar4 = (sx_thread *)(*pcVar1)();
      return psVar4;
    }
    iVar2 = pthread_create(&_var__b->handle,(pthread_attr_t *)local_90,thread_fn,_var__b);
    if (iVar2 != 0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c"
                        ,0xe1,"pthread_create failed");
      pcVar1 = (code *)swi(3);
      psVar4 = (sx_thread *)(*pcVar1)();
      return psVar4;
    }
    sx_semaphore_wait(&_var__b->sem,-1);
    if (user_data2_local != (void *)0x0) {
      sx_thread_setname(_var__b,(char *)user_data2_local);
    }
    alloc_local = (sx_alloc *)_var__b;
  }
  return (sx_thread *)alloc_local;
}

Assistant:

sx_thread* sx_thread_create(const sx_alloc* alloc, sx_thread_cb* callback, void* user_data1,
                            int stack_sz, const char* name, void* user_data2)
{
    sx_thread* thrd = (sx_thread*)sx_malloc(alloc, sizeof(sx_thread));
    if (!thrd)
        return NULL;

    sx_semaphore_init(&thrd->sem);
    thrd->callback = callback;
    thrd->user_data1 = user_data1;
    thrd->user_data2 = user_data2;
    thrd->stack_sz = sx_max(stack_sz, (int)sx_os_minstacksz());
    thrd->running = true;

    pthread_attr_t attr;
    int r = pthread_attr_init(&attr);
    sx_unused(r);
    sx_assertf(r == 0, "pthread_attr_init failed");
    r = pthread_attr_setstacksize(&attr, thrd->stack_sz);
    sx_assertf(r == 0, "pthread_attr_setstacksize failed");

#    if SX_PLATFORM_APPLE
    thrd->name[0] = 0;
    if (name)
        sx_strcpy(thrd->name, sizeof(thrd->name), name);
#    endif

    r = pthread_create(&thrd->handle, &attr, thread_fn, thrd);
    sx_assertf(r == 0, "pthread_create failed");

    // Ensure that thread callback is running
    sx_semaphore_wait(&thrd->sem, -1);

#    if !SX_PLATFORM_APPLE
    if (name)
        sx_thread_setname(thrd, name);
#    endif

    return thrd;
}